

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void cfl_store_inter_block(AV1_COMMON *cm,MACROBLOCKD *xd)

{
  CFL_ALLOWED_TYPE CVar1;
  
  CVar1 = store_cfl_required(cm,xd);
  if (CVar1 != '\0') {
    cfl_store_block(xd,(*xd->mi)->bsize,(*xd->mi)->tx_size);
    return;
  }
  return;
}

Assistant:

static inline void cfl_store_inter_block(AV1_COMMON *const cm,
                                         MACROBLOCKD *const xd) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  if (store_cfl_required(cm, xd)) {
    cfl_store_block(xd, mbmi->bsize, mbmi->tx_size);
  }
}